

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O1

Pln_Man_t * Pln_ManAlloc(Gia_Man_t *pGia,Vec_Int_t *vOrder)

{
  float **ppfVar1;
  uint uVar2;
  Pln_Man_t *pPVar3;
  Hsh_VecMan_t *pHVar4;
  Vec_Que_t *pVVar5;
  int *piVar6;
  Vec_Flt_t *pVVar7;
  float *pfVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  
  iVar14 = 1;
  pPVar3 = (Pln_Man_t *)calloc(1,0x70);
  pPVar3->pGia = pGia;
  pHVar4 = Hsh_VecManStart(iVar14);
  pPVar3->pHashC = pHVar4;
  pHVar4 = Hsh_VecManStart(iVar14);
  pPVar3->pHashM = pHVar4;
  pVVar5 = (Vec_Que_t *)calloc(1,0x20);
  pVVar5->nCap = 0x3e9;
  pVVar5->nSize = 1;
  piVar6 = (int *)malloc(0xfa4);
  memset(piVar6,0xff,0xfa4);
  pVVar5->pHeap = piVar6;
  piVar6 = (int *)malloc(0xfa4);
  memset(piVar6,0xff,0xfa4);
  pVVar5->pOrder = piVar6;
  pPVar3->vQue = pVVar5;
  pVVar7 = (Vec_Flt_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  pfVar8 = (float *)malloc(4000);
  pVVar7->pArray = pfVar8;
  pPVar3->vCounts = pVVar7;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 1000;
  pVVar9->nSize = 0;
  piVar6 = (int *)malloc(4000);
  pVVar9->pArray = piVar6;
  pPVar3->vCoefs = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar9->pArray = piVar6;
  pPVar3->vTempC[0] = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar9->pArray = piVar6;
  pPVar3->vTempC[1] = pVVar9;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar9->pArray = piVar6;
  pPVar3->vTempM[0] = pVVar9;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar10->pArray = piVar6;
  pPVar3->vTempM[1] = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar10->pArray = piVar6;
  pPVar3->vTempM[2] = pVVar10;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  pVVar10->nCap = 100;
  pVVar10->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar10->pArray = piVar6;
  pPVar3->vTempM[3] = pVVar10;
  if (vOrder == (Vec_Int_t *)0x0) {
    uVar2 = pGia->nObjs;
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    uVar11 = 0x10;
    if (0xe < uVar2 - 1) {
      uVar11 = uVar2;
    }
    pVVar10->nSize = 0;
    pVVar10->nCap = uVar11;
    if (uVar11 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc((long)(int)uVar11 << 2);
    }
    pVVar10->pArray = piVar6;
    pVVar10->nSize = uVar2;
    if (0 < (int)uVar2) {
      uVar12 = 0;
      do {
        piVar6[uVar12] = (int)uVar12;
        uVar12 = uVar12 + 1;
      } while (uVar2 != uVar12);
    }
  }
  else {
    pVVar10 = (Vec_Int_t *)malloc(0x10);
    iVar14 = vOrder->nSize;
    lVar13 = (long)iVar14;
    pVVar10->nSize = iVar14;
    pVVar10->nCap = iVar14;
    if (lVar13 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)malloc(lVar13 * 4);
    }
    pVVar10->pArray = piVar6;
    memcpy(piVar6,vOrder->pArray,lVar13 << 2);
  }
  pPVar3->vOrder = pVVar10;
  if (pVVar10->nSize != pGia->nObjs) {
    __assert_fail("Vec_IntSize(p->vOrder) == Gia_ManObjNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPolyn.c"
                  ,0x5c,"Pln_Man_t *Pln_ManAlloc(Gia_Man_t *, Vec_Int_t *)");
  }
  if (pPVar3->vQue->pCostsFlt != (float **)0x0) {
    __assert_fail("p->pCostsFlt == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                  ,0x61,"void Vec_QueSetPriority(Vec_Que_t *, float **)");
  }
  pVVar7 = pPVar3->vCounts;
  ppfVar1 = &pVVar7->pArray;
  pPVar3->vQue->pCostsFlt = ppfVar1;
  Hsh_VecManAdd(pPVar3->pHashC,pPVar3->vTempC[0]);
  Hsh_VecManAdd(pPVar3->pHashM,pVVar9);
  uVar2 = pVVar7->nCap;
  if (pVVar7->nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (*ppfVar1 == (float *)0x0) {
        pfVar8 = (float *)malloc(0x40);
      }
      else {
        pfVar8 = (float *)realloc(*ppfVar1,0x40);
      }
      iVar14 = 0x10;
    }
    else {
      iVar14 = uVar2 * 2;
      if (iVar14 <= (int)uVar2) goto LAB_00678c9d;
      if (*ppfVar1 == (float *)0x0) {
        pfVar8 = (float *)malloc((ulong)uVar2 << 3);
      }
      else {
        pfVar8 = (float *)realloc(*ppfVar1,(ulong)uVar2 << 3);
      }
    }
    pVVar7->pArray = pfVar8;
    pVVar7->nCap = iVar14;
  }
LAB_00678c9d:
  iVar14 = pVVar7->nSize;
  pVVar7->nSize = iVar14 + 1;
  pVVar7->pArray[iVar14] = 0.0;
  Vec_IntPush(pPVar3->vCoefs,0);
  return pPVar3;
}

Assistant:

Pln_Man_t * Pln_ManAlloc( Gia_Man_t * pGia, Vec_Int_t * vOrder )
{
    Pln_Man_t * p = ABC_CALLOC( Pln_Man_t, 1 );
    p->pGia      = pGia;
    p->pHashC    = Hsh_VecManStart( 1000 );
    p->pHashM    = Hsh_VecManStart( 1000 );
    p->vQue      = Vec_QueAlloc( 1000 );
    p->vCounts   = Vec_FltAlloc( 1000 );
    p->vCoefs    = Vec_IntAlloc( 1000 );
    p->vTempC[0] = Vec_IntAlloc( 100 );
    p->vTempC[1] = Vec_IntAlloc( 100 );
    p->vTempM[0] = Vec_IntAlloc( 100 );
    p->vTempM[1] = Vec_IntAlloc( 100 );
    p->vTempM[2] = Vec_IntAlloc( 100 );
    p->vTempM[3] = Vec_IntAlloc( 100 );
    p->vOrder    = vOrder ? Vec_IntDup(vOrder) : Vec_IntStartNatural( Gia_ManObjNum(pGia) );
    assert( Vec_IntSize(p->vOrder) == Gia_ManObjNum(pGia) );
    Vec_QueSetPriority( p->vQue, Vec_FltArrayP(p->vCounts) );
    // add 0-constant and 1-monomial
    Hsh_VecManAdd( p->pHashC, p->vTempC[0] );
    Hsh_VecManAdd( p->pHashM, p->vTempM[0] );
    Vec_FltPush( p->vCounts, 0 );
    Vec_IntPush( p->vCoefs, 0 );
    return p;
}